

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void loop_restoration_read_sb_coeffs
               (AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int plane,int runit_idx)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  SgrprojInfo *sgrproj_info_00;
  WienerInfo *wiener_info_00;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  SgrprojInfo *sgrproj_info;
  WienerInfo *wiener_info;
  int wiener_win;
  RestorationUnitInfo *rui;
  RestorationInfo *rsi;
  aom_reader *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  piVar2 = (int *)(in_RDI + 0x5a20 + (long)in_ECX * 0x40);
  piVar3 = (int *)(*(long *)(piVar2 + 6) + (long)in_R8D * 0x40);
  sgrproj_info_00 = (SgrprojInfo *)(in_RSI + 0x1ff0 + (long)in_ECX * 0x20);
  wiener_info_00 = (WienerInfo *)(in_RSI + 0x2050 + (long)in_ECX * 0xc);
  if (*piVar2 == 3) {
    iVar1 = aom_read_symbol_((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (aom_cdf_prob *)in_stack_ffffffffffffffa8,0);
    *piVar3 = iVar1;
    if (*piVar3 == 1) {
      read_wiener_filter((int)((ulong)sgrproj_info_00 >> 0x20),wiener_info_00,
                         (WienerInfo *)CONCAT44(1,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
    }
    else if (*piVar3 == 2) {
      read_sgrproj_filter(sgrproj_info_00,(SgrprojInfo *)wiener_info_00,
                          (aom_reader *)CONCAT44(2,in_stack_ffffffffffffffb0));
    }
  }
  else if (*piVar2 == 1) {
    iVar1 = aom_read_symbol_((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (aom_cdf_prob *)in_stack_ffffffffffffffa8,0);
    if (iVar1 == 0) {
      *piVar3 = 0;
    }
    else {
      *piVar3 = 1;
      read_wiener_filter((int)((ulong)sgrproj_info_00 >> 0x20),wiener_info_00,
                         (WienerInfo *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                         ,in_stack_ffffffffffffffa8);
    }
  }
  else if (*piVar2 == 2) {
    iVar1 = aom_read_symbol_((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (aom_cdf_prob *)in_stack_ffffffffffffffa8,0);
    if (iVar1 == 0) {
      *piVar3 = 0;
    }
    else {
      *piVar3 = 2;
      read_sgrproj_filter(sgrproj_info_00,(SgrprojInfo *)wiener_info_00,
                          (aom_reader *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  return;
}

Assistant:

static inline void loop_restoration_read_sb_coeffs(const AV1_COMMON *const cm,
                                                   MACROBLOCKD *xd,
                                                   aom_reader *const r,
                                                   int plane, int runit_idx) {
  const RestorationInfo *rsi = &cm->rst_info[plane];
  RestorationUnitInfo *rui = &rsi->unit_info[runit_idx];
  assert(rsi->frame_restoration_type != RESTORE_NONE);

  assert(!cm->features.all_lossless);

  const int wiener_win = (plane > 0) ? WIENER_WIN_CHROMA : WIENER_WIN;
  WienerInfo *wiener_info = xd->wiener_info + plane;
  SgrprojInfo *sgrproj_info = xd->sgrproj_info + plane;

  if (rsi->frame_restoration_type == RESTORE_SWITCHABLE) {
    rui->restoration_type =
        aom_read_symbol(r, xd->tile_ctx->switchable_restore_cdf,
                        RESTORE_SWITCHABLE_TYPES, ACCT_STR);
    switch (rui->restoration_type) {
      case RESTORE_WIENER:
        read_wiener_filter(wiener_win, &rui->wiener_info, wiener_info, r);
        break;
      case RESTORE_SGRPROJ:
        read_sgrproj_filter(&rui->sgrproj_info, sgrproj_info, r);
        break;
      default: assert(rui->restoration_type == RESTORE_NONE); break;
    }
  } else if (rsi->frame_restoration_type == RESTORE_WIENER) {
    if (aom_read_symbol(r, xd->tile_ctx->wiener_restore_cdf, 2, ACCT_STR)) {
      rui->restoration_type = RESTORE_WIENER;
      read_wiener_filter(wiener_win, &rui->wiener_info, wiener_info, r);
    } else {
      rui->restoration_type = RESTORE_NONE;
    }
  } else if (rsi->frame_restoration_type == RESTORE_SGRPROJ) {
    if (aom_read_symbol(r, xd->tile_ctx->sgrproj_restore_cdf, 2, ACCT_STR)) {
      rui->restoration_type = RESTORE_SGRPROJ;
      read_sgrproj_filter(&rui->sgrproj_info, sgrproj_info, r);
    } else {
      rui->restoration_type = RESTORE_NONE;
    }
  }
}